

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_generator.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::cpp::CppGenerator::Generate
          (CppGenerator *this,FileDescriptor *file,string *parameter,
          GeneratorContext *generator_context,string *error)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  size_type sVar4;
  reference pvVar5;
  string *filename;
  undefined4 extraout_var;
  ZeroCopyOutputStream *pZVar6;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  AnnotationCollector *local_6c8;
  AnnotationCollector *local_690;
  undefined1 local_650 [8];
  Printer printer_2;
  scoped_ptr<google::protobuf::io::ZeroCopyOutputStream> local_5a8;
  scoped_ptr<google::protobuf::io::ZeroCopyOutputStream> output_2;
  scoped_ptr<google::protobuf::io::ZeroCopyOutputStream> info_output_1;
  string local_590;
  undefined1 local_570 [8];
  Printer printer_1;
  string info_path_1;
  AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> annotation_collector_1;
  GeneratedCodeInfo annotations_1;
  scoped_ptr<google::protobuf::io::ZeroCopyOutputStream> local_468;
  scoped_ptr<google::protobuf::io::ZeroCopyOutputStream> output_1;
  scoped_ptr<google::protobuf::io::ZeroCopyOutputStream> info_output;
  string local_450;
  undefined1 local_430 [8];
  Printer printer;
  string info_path;
  AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> annotation_collector;
  GeneratedCodeInfo annotations;
  scoped_ptr<google::protobuf::io::ZeroCopyOutputStream> local_328;
  scoped_ptr<google::protobuf::io::ZeroCopyOutputStream> output;
  FileGenerator file_generator;
  string basename;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  int local_cc;
  undefined1 local_c8 [4];
  int i;
  Options file_options;
  undefined1 local_50 [8];
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  options;
  string *error_local;
  GeneratorContext *generator_context_local;
  string *parameter_local;
  FileDescriptor *file_local;
  CppGenerator *this_local;
  
  options.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)error;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)local_50);
  ParseGeneratorParameter
            (parameter,
             (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_50);
  Options::Options((Options *)local_c8);
  local_cc = 0;
  do {
    uVar3 = (ulong)local_cc;
    sVar4 = std::
            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::size((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)local_50);
    if (sVar4 <= uVar3) {
      filename = FileDescriptor::name_abi_cxx11_(file);
      StripProto((string *)
                 &file_generator.package_parts_.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,filename);
      FileGenerator::FileGenerator((FileGenerator *)&output,file,(Options *)local_c8);
      if ((file_options.dllexport_decl.field_2._M_local_buf[9] & 1U) != 0) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &annotations.annotation_.super_RepeatedPtrFieldBase.rep_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &file_generator.package_parts_.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,".proto.h");
        iVar2 = (*generator_context->_vptr_GeneratorContext[2])
                          (generator_context,
                           &annotations.annotation_.super_RepeatedPtrFieldBase.rep_);
        internal::scoped_ptr<google::protobuf::io::ZeroCopyOutputStream>::scoped_ptr
                  (&local_328,(ZeroCopyOutputStream *)CONCAT44(extraout_var,iVar2));
        std::__cxx11::string::~string
                  ((string *)&annotations.annotation_.super_RepeatedPtrFieldBase.rep_);
        GeneratedCodeInfo::GeneratedCodeInfo
                  ((GeneratedCodeInfo *)&annotation_collector.annotation_proto_);
        io::AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo>::AnnotationProtoCollector
                  ((AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> *)
                   ((long)&info_path.field_2 + 8),
                   (GeneratedCodeInfo *)&annotation_collector.annotation_proto_);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &printer.annotation_collector_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &file_generator.package_parts_.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,".proto.h.meta");
        pZVar6 = internal::scoped_ptr<google::protobuf::io::ZeroCopyOutputStream>::get(&local_328);
        if ((file_options.dllexport_decl.field_2._M_local_buf[0xb] & 1U) == 0) {
          local_690 = (AnnotationCollector *)0x0;
        }
        else {
          local_690 = (AnnotationCollector *)((long)&info_path.field_2 + 8);
        }
        io::Printer::Printer((Printer *)local_430,pZVar6,'$',local_690);
        info_output.ptr_._6_1_ = 0;
        if ((file_options.dllexport_decl.field_2._M_local_buf[0xb] & 1U) == 0) {
          std::allocator<char>::allocator();
          info_output.ptr_._6_1_ = 1;
          std::__cxx11::string::string
                    ((string *)&local_450,"",(allocator *)((long)&info_output.ptr_ + 7));
        }
        else {
          std::__cxx11::string::string
                    ((string *)&local_450,(string *)&printer.annotation_collector_);
        }
        FileGenerator::GenerateProtoHeader((FileGenerator *)&output,(Printer *)local_430,&local_450)
        ;
        std::__cxx11::string::~string((string *)&local_450);
        if ((info_output.ptr_._6_1_ & 1) != 0) {
          std::allocator<char>::~allocator((allocator<char> *)((long)&info_output.ptr_ + 7));
        }
        if ((file_options.dllexport_decl.field_2._M_local_buf[0xb] & 1U) != 0) {
          iVar2 = (*generator_context->_vptr_GeneratorContext[2])
                            (generator_context,&printer.annotation_collector_);
          internal::scoped_ptr<google::protobuf::io::ZeroCopyOutputStream>::scoped_ptr
                    (&output_1,(ZeroCopyOutputStream *)CONCAT44(extraout_var_00,iVar2));
          pZVar6 = internal::scoped_ptr<google::protobuf::io::ZeroCopyOutputStream>::get(&output_1);
          MessageLite::SerializeToZeroCopyStream
                    ((MessageLite *)&annotation_collector.annotation_proto_,pZVar6);
          internal::scoped_ptr<google::protobuf::io::ZeroCopyOutputStream>::~scoped_ptr(&output_1);
        }
        io::Printer::~Printer((Printer *)local_430);
        std::__cxx11::string::~string((string *)&printer.annotation_collector_);
        io::AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo>::~AnnotationProtoCollector
                  ((AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> *)
                   ((long)&info_path.field_2 + 8));
        GeneratedCodeInfo::~GeneratedCodeInfo
                  ((GeneratedCodeInfo *)&annotation_collector.annotation_proto_);
        internal::scoped_ptr<google::protobuf::io::ZeroCopyOutputStream>::~scoped_ptr(&local_328);
      }
      std::__cxx11::string::append
                ((char *)&file_generator.package_parts_.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &annotations_1.annotation_.super_RepeatedPtrFieldBase.rep_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &file_generator.package_parts_.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,".h");
      iVar2 = (*generator_context->_vptr_GeneratorContext[2])
                        (generator_context,
                         &annotations_1.annotation_.super_RepeatedPtrFieldBase.rep_);
      internal::scoped_ptr<google::protobuf::io::ZeroCopyOutputStream>::scoped_ptr
                (&local_468,(ZeroCopyOutputStream *)CONCAT44(extraout_var_01,iVar2));
      std::__cxx11::string::~string
                ((string *)&annotations_1.annotation_.super_RepeatedPtrFieldBase.rep_);
      GeneratedCodeInfo::GeneratedCodeInfo
                ((GeneratedCodeInfo *)&annotation_collector_1.annotation_proto_);
      io::AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo>::AnnotationProtoCollector
                ((AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> *)
                 ((long)&info_path_1.field_2 + 8),
                 (GeneratedCodeInfo *)&annotation_collector_1.annotation_proto_);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &printer_1.annotation_collector_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &file_generator.package_parts_.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,".h.meta");
      pZVar6 = internal::scoped_ptr<google::protobuf::io::ZeroCopyOutputStream>::get(&local_468);
      if ((file_options.dllexport_decl.field_2._M_local_buf[0xb] & 1U) == 0) {
        local_6c8 = (AnnotationCollector *)0x0;
      }
      else {
        local_6c8 = (AnnotationCollector *)((long)&info_path_1.field_2 + 8);
      }
      io::Printer::Printer((Printer *)local_570,pZVar6,'$',local_6c8);
      info_output_1.ptr_._6_1_ = 0;
      if ((file_options.dllexport_decl.field_2._M_local_buf[0xb] & 1U) == 0) {
        std::allocator<char>::allocator();
        info_output_1.ptr_._6_1_ = 1;
        std::__cxx11::string::string
                  ((string *)&local_590,"",(allocator *)((long)&info_output_1.ptr_ + 7));
      }
      else {
        std::__cxx11::string::string
                  ((string *)&local_590,(string *)&printer_1.annotation_collector_);
      }
      FileGenerator::GeneratePBHeader((FileGenerator *)&output,(Printer *)local_570,&local_590);
      std::__cxx11::string::~string((string *)&local_590);
      if ((info_output_1.ptr_._6_1_ & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)((long)&info_output_1.ptr_ + 7));
      }
      if ((file_options.dllexport_decl.field_2._M_local_buf[0xb] & 1U) != 0) {
        iVar2 = (*generator_context->_vptr_GeneratorContext[2])
                          (generator_context,&printer_1.annotation_collector_);
        internal::scoped_ptr<google::protobuf::io::ZeroCopyOutputStream>::scoped_ptr
                  (&output_2,(ZeroCopyOutputStream *)CONCAT44(extraout_var_02,iVar2));
        pZVar6 = internal::scoped_ptr<google::protobuf::io::ZeroCopyOutputStream>::get(&output_2);
        MessageLite::SerializeToZeroCopyStream
                  ((MessageLite *)&annotation_collector_1.annotation_proto_,pZVar6);
        internal::scoped_ptr<google::protobuf::io::ZeroCopyOutputStream>::~scoped_ptr(&output_2);
      }
      io::Printer::~Printer((Printer *)local_570);
      std::__cxx11::string::~string((string *)&printer_1.annotation_collector_);
      io::AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo>::~AnnotationProtoCollector
                ((AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> *)
                 ((long)&info_path_1.field_2 + 8));
      GeneratedCodeInfo::~GeneratedCodeInfo
                ((GeneratedCodeInfo *)&annotation_collector_1.annotation_proto_);
      internal::scoped_ptr<google::protobuf::io::ZeroCopyOutputStream>::~scoped_ptr(&local_468);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &printer_2.annotation_collector_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &file_generator.package_parts_.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,".cc");
      iVar2 = (*generator_context->_vptr_GeneratorContext[2])
                        (generator_context,&printer_2.annotation_collector_);
      internal::scoped_ptr<google::protobuf::io::ZeroCopyOutputStream>::scoped_ptr
                (&local_5a8,(ZeroCopyOutputStream *)CONCAT44(extraout_var_03,iVar2));
      std::__cxx11::string::~string((string *)&printer_2.annotation_collector_);
      pZVar6 = internal::scoped_ptr<google::protobuf::io::ZeroCopyOutputStream>::get(&local_5a8);
      io::Printer::Printer((Printer *)local_650,pZVar6,'$');
      FileGenerator::GenerateSource((FileGenerator *)&output,(Printer *)local_650);
      io::Printer::~Printer((Printer *)local_650);
      internal::scoped_ptr<google::protobuf::io::ZeroCopyOutputStream>::~scoped_ptr(&local_5a8);
      this_local._7_1_ = true;
      FileGenerator::~FileGenerator((FileGenerator *)&output);
      std::__cxx11::string::~string
                ((string *)
                 &file_generator.package_parts_.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
LAB_0037185d:
      Options::~Options((Options *)local_c8);
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_50);
      return this_local._7_1_;
    }
    pvVar5 = std::
             vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_50,(long)local_cc);
    bVar1 = std::operator==(&pvVar5->first,"dllexport_decl");
    if (bVar1) {
      pvVar5 = std::
               vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)local_50,(long)local_cc);
      std::__cxx11::string::operator=((string *)local_c8,(string *)&pvVar5->second);
    }
    else {
      pvVar5 = std::
               vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)local_50,(long)local_cc);
      bVar1 = std::operator==(&pvVar5->first,"safe_boundary_check");
      if (bVar1) {
        file_options.dllexport_decl.field_2._M_local_buf[8] = '\x01';
      }
      else {
        pvVar5 = std::
                 vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[]((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)local_50,(long)local_cc);
        bVar1 = std::operator==(&pvVar5->first,"annotate_headers");
        if (bVar1) {
          file_options.dllexport_decl.field_2._M_local_buf[0xb] = '\x01';
        }
        else {
          pvVar5 = std::
                   vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)local_50,(long)local_cc);
          bVar1 = std::operator==(&pvVar5->first,"annotation_pragma_name");
          if (bVar1) {
            pvVar5 = std::
                     vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[]((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)local_50,(long)local_cc);
            std::__cxx11::string::operator=
                      ((string *)&file_options.safe_boundary_check,(string *)&pvVar5->second);
          }
          else {
            pvVar5 = std::
                     vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[]((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)local_50,(long)local_cc);
            bVar1 = std::operator==(&pvVar5->first,"annotation_guard_name");
            if (bVar1) {
              pvVar5 = std::
                       vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator[]((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)local_50,(long)local_cc);
              std::__cxx11::string::operator=
                        ((string *)(file_options.annotation_pragma_name.field_2._M_local_buf + 8),
                         (string *)&pvVar5->second);
            }
            else {
              pvVar5 = std::
                       vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator[]((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)local_50,(long)local_cc);
              bVar1 = std::operator==(&pvVar5->first,"lite");
              if (bVar1) {
                file_options.dllexport_decl.field_2._M_local_buf[0xc] = '\x01';
              }
              else {
                pvVar5 = std::
                         vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::operator[]((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)local_50,(long)local_cc);
                bVar1 = std::operator==(&pvVar5->first,"table_driven_parsing");
                if (!bVar1) {
                  pvVar5 = std::
                           vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ::operator[]((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)local_50,(long)local_cc);
                  std::operator+(&local_f0,"Unknown generator option: ",&pvVar5->first);
                  std::__cxx11::string::operator=
                            ((string *)
                             options.
                             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)&local_f0)
                  ;
                  std::__cxx11::string::~string((string *)&local_f0);
                  this_local._7_1_ = false;
                  goto LAB_0037185d;
                }
                file_options.dllexport_decl.field_2._M_local_buf[0xd] = '\x01';
              }
            }
          }
        }
      }
    }
    local_cc = local_cc + 1;
  } while( true );
}

Assistant:

bool CppGenerator::Generate(const FileDescriptor* file,
                            const string& parameter,
                            GeneratorContext* generator_context,
                            string* error) const {
  std::vector<std::pair<string, string> > options;
  ParseGeneratorParameter(parameter, &options);

  // -----------------------------------------------------------------
  // parse generator options

  // TODO(kenton):  If we ever have more options, we may want to create a
  //   class that encapsulates them which we can pass down to all the
  //   generator classes.  Currently we pass dllexport_decl down to all of
  //   them via the constructors, but we don't want to have to add another
  //   constructor parameter for every option.

  // If the dllexport_decl option is passed to the compiler, we need to write
  // it in front of every symbol that should be exported if this .proto is
  // compiled into a Windows DLL.  E.g., if the user invokes the protocol
  // compiler as:
  //   protoc --cpp_out=dllexport_decl=FOO_EXPORT:outdir foo.proto
  // then we'll define classes like this:
  //   class FOO_EXPORT Foo {
  //     ...
  //   }
  // FOO_EXPORT is a macro which should expand to __declspec(dllexport) or
  // __declspec(dllimport) depending on what is being compiled.
  //
  Options file_options;

  for (int i = 0; i < options.size(); i++) {
    if (options[i].first == "dllexport_decl") {
      file_options.dllexport_decl = options[i].second;
    } else if (options[i].first == "safe_boundary_check") {
      file_options.safe_boundary_check = true;
    } else if (options[i].first == "annotate_headers") {
      file_options.annotate_headers = true;
    } else if (options[i].first == "annotation_pragma_name") {
      file_options.annotation_pragma_name = options[i].second;
    } else if (options[i].first == "annotation_guard_name") {
      file_options.annotation_guard_name = options[i].second;
    } else if (options[i].first == "lite") {
      file_options.enforce_lite = true;
    } else if (options[i].first == "table_driven_parsing") {
      file_options.table_driven_parsing = true;
    } else {
      *error = "Unknown generator option: " + options[i].first;
      return false;
    }
  }

  // -----------------------------------------------------------------


  string basename = StripProto(file->name());

  FileGenerator file_generator(file, file_options);

  // Generate header(s).
  if (file_options.proto_h) {
    google::protobuf::scoped_ptr<io::ZeroCopyOutputStream> output(
        generator_context->Open(basename + ".proto.h"));
    GeneratedCodeInfo annotations;
    io::AnnotationProtoCollector<GeneratedCodeInfo> annotation_collector(
        &annotations);
    string info_path = basename + ".proto.h.meta";
    io::Printer printer(output.get(), '$', file_options.annotate_headers
                                               ? &annotation_collector
                                               : NULL);
    file_generator.GenerateProtoHeader(
        &printer, file_options.annotate_headers ? info_path : "");
    if (file_options.annotate_headers) {
      google::protobuf::scoped_ptr<io::ZeroCopyOutputStream> info_output(
          generator_context->Open(info_path));
      annotations.SerializeToZeroCopyStream(info_output.get());
    }
  }

  basename.append(".pb");
  {
    google::protobuf::scoped_ptr<io::ZeroCopyOutputStream> output(
        generator_context->Open(basename + ".h"));
    GeneratedCodeInfo annotations;
    io::AnnotationProtoCollector<GeneratedCodeInfo> annotation_collector(
        &annotations);
    string info_path = basename + ".h.meta";
    io::Printer printer(output.get(), '$', file_options.annotate_headers
                                               ? &annotation_collector
                                               : NULL);
    file_generator.GeneratePBHeader(
        &printer, file_options.annotate_headers ? info_path : "");
    if (file_options.annotate_headers) {
      google::protobuf::scoped_ptr<io::ZeroCopyOutputStream> info_output(
          generator_context->Open(info_path));
      annotations.SerializeToZeroCopyStream(info_output.get());
    }
  }

  // Generate cc file.
  {
    google::protobuf::scoped_ptr<io::ZeroCopyOutputStream> output(
        generator_context->Open(basename + ".cc"));
    io::Printer printer(output.get(), '$');
    file_generator.GenerateSource(&printer);
  }

  return true;
}